

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

matrix4 * matrix4_projection_ortho3d_rh_EXP
                    (matrix4 *self,float xmin,float xmax,float ymin,float ymax,float zNear,
                    float zFar)

{
  float height;
  float width;
  float zFar_local;
  float zNear_local;
  float ymax_local;
  float ymin_local;
  float xmax_local;
  float xmin_local;
  matrix4 *self_local;
  
  matrix4_zero(self);
  (self->field_0).m[0] = 2.0 / (xmax - xmin);
  (self->field_0).m[5] = 2.0 / (ymax - ymin);
  (self->field_0).m[10] = 1.0 / (zFar - zNear);
  (self->field_0).m[0xe] = zNear / (zNear - zFar);
  (self->field_0).m[0xf] = 1.0;
  return self;
}

Assistant:

HYPAPI struct matrix4 *matrix4_projection_ortho3d_rh_EXP(struct matrix4 *self,
							 HYP_FLOAT xmin, HYP_FLOAT xmax,
							 HYP_FLOAT ymin, HYP_FLOAT ymax,
							 HYP_FLOAT zNear, HYP_FLOAT zFar)
{
	HYP_FLOAT width;
	HYP_FLOAT height;

	matrix4_zero(self);

	width = xmax - xmin;
	height = ymax - ymin;

	self->c00 = 2.0f / width;
	self->c11 = 2.0f / height;
	self->c22 = 1.0f / (zFar - zNear);
	self->c23 = zNear / (zNear - zFar);
	self->c33 = 1.0f;

	return self;
}